

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjGen.hh
# Opt level: O3

string * __thiscall
QPDFObjGen::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFObjGen *this,char separator)

{
  size_type *psVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  string *psVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong *puVar10;
  ulong uVar11;
  uint uVar12;
  string __str_1;
  string __str;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string *local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  uVar2 = this->obj;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar3) {
    uVar11 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar12 = uVar6;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00141cb8;
      }
      if (uVar9 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00141cb8;
      }
      if (uVar9 < 10000) goto LAB_00141cb8;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar12 + 4;
    } while (99999 < uVar9);
    uVar12 = uVar12 + 1;
  }
LAB_00141cb8:
  local_50 = local_40;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)(uVar2 >> 0x1f)),uVar12,uVar3);
  plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_88 = *puVar10;
    lStack_80 = plVar7[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar10;
    local_98 = (ulong *)*plVar7;
  }
  local_90 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->gen;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar12 = 1;
  if (9 < uVar3) {
    uVar11 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar12 = uVar6;
      uVar9 = (uint)uVar11;
      if (uVar9 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00141dac;
      }
      if (uVar9 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00141dac;
      }
      if (uVar9 < 10000) goto LAB_00141dac;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar12 + 4;
    } while (99999 < uVar9);
    uVar12 = uVar12 + 1;
  }
LAB_00141dac:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar12 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_78),uVar12,uVar3);
  psVar5 = local_58;
  uVar11 = 0xf;
  if (local_98 != &local_88) {
    uVar11 = local_88;
  }
  if (uVar11 < (ulong)(local_70 + local_90)) {
    uVar11 = 0xf;
    if (local_78 != local_68) {
      uVar11 = local_68[0];
    }
    if ((ulong)(local_70 + local_90) <= uVar11) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
      goto LAB_00141e3a;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78);
LAB_00141e3a:
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    uVar4 = puVar8[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&psVar5->field_2 + 8) = uVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*puVar8;
    (psVar5->field_2)._M_allocated_capacity = *psVar1;
  }
  psVar5->_M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return psVar5;
}

Assistant:

std::string
    unparse(char separator = ',') const
    {
        return std::to_string(obj) + separator + std::to_string(gen);
    }